

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx512::DiscMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  Scene *scene;
  byte bVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined4 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  DiscIntersectorHitM<4> hit;
  int local_138;
  float local_134;
  RayQueryContext *local_130;
  RTCFilterFunctionNArguments local_128;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  undefined4 local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  Primitive *local_c0;
  undefined1 local_b8 [16];
  float local_a8 [8];
  undefined1 local_88 [16];
  float local_78 [4];
  float local_68 [4];
  float local_58 [4];
  undefined1 local_48 [16];
  undefined1 auVar37 [64];
  
  pSVar7 = context->scene;
  pGVar8 = (pSVar7->geometries).items[Disc->sharedGeomID].ptr;
  lVar9 = *(long *)&pGVar8->field_0x58;
  _Var10 = pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar26 = *(undefined1 (*) [16])(lVar9 + (Disc->primIDs).field_0.i[0] * _Var10);
  auVar33 = *(undefined1 (*) [16])(lVar9 + (Disc->primIDs).field_0.i[1] * _Var10);
  auVar34 = *(undefined1 (*) [16])(lVar9 + (Disc->primIDs).field_0.i[2] * _Var10);
  auVar5 = *(undefined1 (*) [16])(lVar9 + (Disc->primIDs).field_0.i[3] * _Var10);
  auVar13 = vunpcklps_avx(auVar26,auVar34);
  auVar34 = vunpckhps_avx(auVar26,auVar34);
  auVar26 = vunpcklps_avx(auVar33,auVar5);
  auVar33 = vunpckhps_avx(auVar33,auVar5);
  auVar27 = vunpcklps_avx(auVar13,auVar26);
  auVar5 = vunpckhps_avx(auVar13,auVar26);
  auVar13 = vunpcklps_avx(auVar34,auVar33);
  local_48 = vpbroadcastd_avx512vl();
  aVar6 = (ray->super_RayK<1>).dir.field_0;
  fVar1 = *(float *)&(ray->super_RayK<1>).dir.field_0;
  auVar31._4_4_ = fVar1;
  auVar31._0_4_ = fVar1;
  auVar31._8_4_ = fVar1;
  auVar31._12_4_ = fVar1;
  auVar26 = *(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar32._4_4_ = fVar2;
  auVar32._0_4_ = fVar2;
  auVar32._8_4_ = fVar2;
  auVar32._12_4_ = fVar2;
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar38 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar39 = (ray->super_RayK<1>).tfar;
  fVar40 = (float)(ray->super_RayK<1>).mask;
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar47._0_4_ = fVar4 * fVar4;
  auVar47._4_4_ = fVar38 * fVar38;
  auVar47._8_4_ = fVar39 * fVar39;
  auVar47._12_4_ = fVar40 * fVar40;
  auVar26 = vfmadd231ps_fma(auVar47,auVar26,auVar26);
  auVar26 = vfmadd231ps_fma(auVar26,(undefined1  [16])aVar6,(undefined1  [16])aVar6);
  uVar46 = auVar26._0_4_;
  auVar28._4_4_ = uVar46;
  auVar28._0_4_ = uVar46;
  auVar28._8_4_ = uVar46;
  auVar28._12_4_ = uVar46;
  auVar25 = vrcp14ps_avx512vl(auVar28);
  auVar26._8_4_ = 0x3f800000;
  auVar26._0_8_ = &DAT_3f8000003f800000;
  auVar26._12_4_ = 0x3f800000;
  auVar26 = vfnmadd213ps_avx512vl(auVar28,auVar25,auVar26);
  auVar26 = vfmadd132ps_fma(auVar26,auVar25,auVar25);
  uVar46 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar25._4_4_ = uVar46;
  auVar25._0_4_ = uVar46;
  auVar25._8_4_ = uVar46;
  auVar25._12_4_ = uVar46;
  auVar25 = vsubps_avx512vl(auVar27,auVar25);
  uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar27._4_4_ = uVar46;
  auVar27._0_4_ = uVar46;
  auVar27._8_4_ = uVar46;
  auVar27._12_4_ = uVar46;
  auVar27 = vsubps_avx512vl(auVar5,auVar27);
  uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar5._4_4_ = uVar46;
  auVar5._0_4_ = uVar46;
  auVar5._8_4_ = uVar46;
  auVar5._12_4_ = uVar46;
  auVar28 = vsubps_avx512vl(auVar13,auVar5);
  fVar38 = auVar28._0_4_;
  auVar42._0_4_ = fVar38 * fVar3;
  fVar39 = auVar28._4_4_;
  auVar42._4_4_ = fVar39 * fVar3;
  fVar40 = auVar28._8_4_;
  auVar42._8_4_ = fVar40 * fVar3;
  fVar41 = auVar28._12_4_;
  auVar42._12_4_ = fVar41 * fVar3;
  auVar5 = vfmadd231ps_fma(auVar42,auVar27,auVar32);
  auVar5 = vfmadd231ps_fma(auVar5,auVar25,auVar31);
  local_88._0_4_ = auVar5._0_4_ * auVar26._0_4_;
  local_88._4_4_ = auVar5._4_4_ * auVar26._4_4_;
  local_88._8_4_ = auVar5._8_4_ * auVar26._8_4_;
  local_88._12_4_ = auVar5._12_4_ * auVar26._12_4_;
  auVar48 = ZEXT1664(local_88);
  fVar4 = (ray->super_RayK<1>).tfar;
  auVar13._4_4_ = fVar4;
  auVar13._0_4_ = fVar4;
  auVar13._8_4_ = fVar4;
  auVar13._12_4_ = fVar4;
  uVar14 = vcmpps_avx512vl(local_88,auVar13,2);
  auVar26 = vpbroadcastd_avx512vl();
  uVar46 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar17._4_4_ = uVar46;
  auVar17._0_4_ = uVar46;
  auVar17._8_4_ = uVar46;
  auVar17._12_4_ = uVar46;
  uVar15 = vcmpps_avx512vl(local_88,auVar17,0xd);
  uVar16 = vpcmpgtd_avx512vl(auVar26,_DAT_01ff0cf0);
  bVar23 = (byte)uVar14 & (byte)uVar15 & 0xf & (byte)uVar16;
  if (bVar23 != 0) {
    auVar5 = vunpckhps_avx(auVar34,auVar33);
    auVar34._0_4_ = local_88._0_4_ * fVar1;
    auVar34._4_4_ = local_88._4_4_ * fVar1;
    auVar34._8_4_ = local_88._8_4_ * fVar1;
    auVar34._12_4_ = local_88._12_4_ * fVar1;
    auVar43._0_4_ = local_88._0_4_ * fVar2;
    auVar43._4_4_ = local_88._4_4_ * fVar2;
    auVar43._8_4_ = local_88._8_4_ * fVar2;
    auVar43._12_4_ = local_88._12_4_ * fVar2;
    auVar44._0_4_ = local_88._0_4_ * fVar3;
    auVar44._4_4_ = local_88._4_4_ * fVar3;
    auVar44._8_4_ = local_88._8_4_ * fVar3;
    auVar44._12_4_ = local_88._12_4_ * fVar3;
    auVar26 = vsubps_avx(auVar25,auVar34);
    auVar33 = vsubps_avx(auVar27,auVar43);
    auVar34 = vsubps_avx(auVar28,auVar44);
    auVar45._0_4_ = auVar34._0_4_ * auVar34._0_4_;
    auVar45._4_4_ = auVar34._4_4_ * auVar34._4_4_;
    auVar45._8_4_ = auVar34._8_4_ * auVar34._8_4_;
    auVar45._12_4_ = auVar34._12_4_ * auVar34._12_4_;
    auVar33 = vfmadd231ps_fma(auVar45,auVar33,auVar33);
    auVar26 = vfmadd231ps_fma(auVar33,auVar26,auVar26);
    auVar33._0_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar33._4_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar33._8_4_ = auVar5._8_4_ * auVar5._8_4_;
    auVar33._12_4_ = auVar5._12_4_ * auVar5._12_4_;
    uVar14 = vcmpps_avx512vl(auVar26,auVar33,2);
    bVar23 = (byte)uVar14 & bVar23;
    if (bVar23 != 0) {
      auVar35._0_4_ = fVar38 * fVar38;
      auVar35._4_4_ = fVar39 * fVar39;
      auVar35._8_4_ = fVar40 * fVar40;
      auVar35._12_4_ = fVar41 * fVar41;
      auVar26 = vfmadd213ps_fma(auVar27,auVar27,auVar35);
      auVar26 = vfmadd213ps_fma(auVar25,auVar25,auVar26);
      uVar14 = vcmpps_avx512vl(auVar26,auVar33,6);
      bVar23 = bVar23 & (byte)uVar14;
      uVar24 = (uint)bVar23;
      if (bVar23 != 0) {
        local_a8[0] = 0.0;
        local_a8[1] = 0.0;
        local_a8[2] = 0.0;
        local_a8[3] = 0.0;
        local_a8[4] = 0.0;
        local_a8[5] = 0.0;
        local_a8[6] = 0.0;
        local_a8[7] = 0.0;
        local_78[0] = -fVar1;
        local_78[1] = -fVar1;
        local_78[2] = -fVar1;
        local_78[3] = -fVar1;
        local_68[0] = -fVar2;
        local_68[1] = -fVar2;
        local_68[2] = -fVar2;
        local_68[3] = -fVar2;
        local_58[0] = -fVar3;
        local_58[1] = -fVar3;
        local_58[2] = -fVar3;
        local_58[3] = -fVar3;
        auVar36._8_4_ = 0x7f800000;
        auVar36._0_8_ = 0x7f8000007f800000;
        auVar36._12_4_ = 0x7f800000;
        auVar37 = ZEXT1664(auVar36);
        auVar26 = vblendmps_avx512vl(auVar36,local_88);
        auVar29._0_4_ = (uint)(bVar23 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar23 & 1) * (int)-fVar1
        ;
        bVar12 = (bool)(bVar23 >> 1 & 1);
        auVar29._4_4_ = (uint)bVar12 * auVar26._4_4_ | (uint)!bVar12 * (int)-fVar1;
        bVar12 = (bool)(bVar23 >> 2 & 1);
        auVar29._8_4_ = (uint)bVar12 * auVar26._8_4_ | (uint)!bVar12 * (int)-fVar1;
        auVar29._12_4_ =
             (uint)(bVar23 >> 3) * auVar26._12_4_ | (uint)!(bool)(bVar23 >> 3) * (int)-fVar1;
        auVar26 = vshufps_avx(auVar29,auVar29,0xb1);
        auVar26 = vminps_avx(auVar26,auVar29);
        auVar33 = vshufpd_avx(auVar26,auVar26,1);
        auVar26 = vminps_avx(auVar33,auVar26);
        uVar14 = vcmpps_avx512vl(auVar29,auVar26,0);
        uVar21 = uVar24;
        if (((byte)uVar14 & bVar23) != 0) {
          uVar21 = (uint)((byte)uVar14 & bVar23);
        }
        uVar19 = 0;
        for (; local_130 = context, (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
          uVar19 = uVar19 + 1;
        }
        do {
          uVar22 = uVar19 & 0xff;
          uVar21 = *(uint *)(local_48 + (ulong)uVar22 * 4);
          pGVar8 = (pSVar7->geometries).items[uVar21].ptr;
          if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
            bVar23 = ~(byte)(1 << (uVar19 & 0x1f)) & (byte)uVar24;
LAB_01a869f3:
            uVar24 = (uint)bVar23;
            bVar12 = true;
          }
          else {
            if ((local_130->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              uVar20 = (ulong)(uVar22 * 4);
              local_f8 = *(undefined4 *)((long)local_78 + uVar20);
              local_f4 = *(undefined4 *)((long)local_68 + uVar20);
              local_f0 = *(undefined4 *)((long)local_58 + uVar20);
              local_ec = *(undefined4 *)((long)local_a8 + uVar20);
              local_e8 = *(undefined4 *)((long)local_a8 + uVar20 + 0x10);
              local_e4 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar20);
              local_e0 = uVar21;
              local_dc = local_130->user->instID[0];
              local_d8 = local_130->user->instPrimID[0];
              local_134 = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_88 + uVar20);
              local_138 = -1;
              local_128.valid = &local_138;
              local_128.geometryUserPtr = pGVar8->userPtr;
              local_128.context = local_130->user;
              local_128.ray = (RTCRayN *)ray;
              local_128.hit = (RTCHitN *)&local_f8;
              local_128.N = 1;
              local_b8 = auVar48._0_16_;
              if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a86b62:
                p_Var11 = local_130->args->filter;
                if (p_Var11 != (RTCFilterFunctionN)0x0) {
                  if (((local_130->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar8->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    (*p_Var11)(&local_128);
                    auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar48 = ZEXT1664(local_b8);
                  }
                  if (*local_128.valid == 0) goto LAB_01a86c0e;
                }
                (((Vec3f *)((long)local_128.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_128.hit;
                (((Vec3f *)((long)local_128.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_128.hit + 4);
                (((Vec3f *)((long)local_128.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_128.hit + 8);
                *(float *)((long)local_128.ray + 0x3c) = *(float *)(local_128.hit + 0xc);
                local_134 = *(float *)(local_128.hit + 0x10);
                *(float *)((long)local_128.ray + 0x40) = local_134;
                *(float *)((long)local_128.ray + 0x44) = *(float *)(local_128.hit + 0x14);
                *(float *)((long)local_128.ray + 0x48) = *(float *)(local_128.hit + 0x18);
                *(float *)((long)local_128.ray + 0x4c) = *(float *)(local_128.hit + 0x1c);
                *(float *)((long)local_128.ray + 0x50) = *(float *)(local_128.hit + 0x20);
              }
              else {
                local_c0 = Disc;
                (*pGVar8->intersectionFilterN)(&local_128);
                auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar48 = ZEXT1664(local_b8);
                Disc = local_c0;
                if (*local_128.valid != 0) goto LAB_01a86b62;
LAB_01a86c0e:
                (ray->super_RayK<1>).tfar = local_134;
              }
              auVar29 = ZEXT416((uint)local_134);
              fVar1 = (ray->super_RayK<1>).tfar;
              auVar18._4_4_ = fVar1;
              auVar18._0_4_ = fVar1;
              auVar18._8_4_ = fVar1;
              auVar18._12_4_ = fVar1;
              uVar14 = vcmpps_avx512vl(auVar48._0_16_,auVar18,2);
              bVar23 = ~(byte)(1 << (uVar19 & 0x1f)) & (byte)uVar24 & (byte)uVar14;
              goto LAB_01a869f3;
            }
            bVar12 = false;
          }
          if (!bVar12) {
            uVar20 = (ulong)(uVar22 << 2);
            fVar1 = *(float *)((long)local_a8 + uVar20);
            fVar2 = *(float *)((long)local_a8 + uVar20 + 0x10);
            (ray->super_RayK<1>).tfar = *(float *)(local_88 + uVar20);
            (ray->Ng).field_0.field_0.x = *(float *)((long)local_78 + uVar20);
            (ray->Ng).field_0.field_0.y = *(float *)((long)local_68 + uVar20);
            (ray->Ng).field_0.field_0.z = *(float *)((long)local_58 + uVar20);
            ray->u = fVar1;
            ray->v = fVar2;
            ray->primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar20);
            ray->geomID = uVar21;
            ray->instID[0] = local_130->user->instID[0];
            ray->instPrimID[0] = local_130->user->instPrimID[0];
            return;
          }
          bVar23 = (byte)uVar24;
          if (bVar23 == 0) {
            return;
          }
          auVar26 = vblendmps_avx512vl(auVar37._0_16_,auVar48._0_16_);
          auVar30._0_4_ =
               (uint)(bVar23 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar23 & 1) * auVar29._0_4_;
          bVar12 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar30._4_4_ = (uint)bVar12 * auVar26._4_4_ | (uint)!bVar12 * auVar29._4_4_;
          bVar12 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar30._8_4_ = (uint)bVar12 * auVar26._8_4_ | (uint)!bVar12 * auVar29._8_4_;
          auVar30._12_4_ =
               (uVar24 >> 3) * auVar26._12_4_ | (uint)!SUB41(uVar24 >> 3,0) * auVar29._12_4_;
          auVar26 = vshufps_avx(auVar30,auVar30,0xb1);
          auVar26 = vminps_avx(auVar26,auVar30);
          auVar33 = vshufpd_avx(auVar26,auVar26,1);
          auVar26 = vminps_avx(auVar33,auVar26);
          uVar14 = vcmpps_avx512vl(auVar30,auVar26,0);
          bVar23 = (byte)uVar14 & bVar23;
          uVar21 = uVar24;
          if (bVar23 != 0) {
            uVar21 = (uint)bVar23;
          }
          uVar19 = 0;
          for (; auVar29 = auVar30, (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x80000000) {
            uVar19 = uVar19 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }